

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O0

void jinit_memory_mgr(j_common_ptr cinfo)

{
  int iVar1;
  char local_39;
  char *pcStack_38;
  char ch;
  char *memenv;
  size_t test_mac;
  long lStack_20;
  int pool;
  long max_to_use;
  my_mem_ptr mem;
  j_common_ptr cinfo_local;
  
  cinfo->mem = (jpeg_memory_mgr *)0x0;
  memenv = (char *)0x3b9aca00;
  mem = (my_mem_ptr)cinfo;
  lStack_20 = jpeg_mem_init(cinfo);
  max_to_use = (long)jpeg_get_small((j_common_ptr)mem,0xa8);
  if ((void *)max_to_use == (void *)0x0) {
    jpeg_mem_term((j_common_ptr)mem);
    *(undefined4 *)((mem->pub).alloc_small + 0x28) = 0x38;
    *(undefined4 *)((mem->pub).alloc_small + 0x2c) = 0;
    (**(code **)(mem->pub).alloc_small)(mem);
  }
  *(code **)max_to_use = alloc_small;
  *(code **)(max_to_use + 8) = alloc_large;
  *(code **)(max_to_use + 0x10) = alloc_sarray;
  *(code **)(max_to_use + 0x18) = alloc_barray;
  *(code **)(max_to_use + 0x20) = request_virt_sarray;
  *(code **)(max_to_use + 0x28) = request_virt_barray;
  *(code **)(max_to_use + 0x30) = realize_virt_arrays;
  *(code **)(max_to_use + 0x38) = access_virt_sarray;
  *(code **)(max_to_use + 0x40) = access_virt_barray;
  *(code **)(max_to_use + 0x48) = free_pool;
  *(code **)(max_to_use + 0x50) = self_destruct;
  *(undefined8 *)(max_to_use + 0x60) = 1000000000;
  *(long *)(max_to_use + 0x58) = lStack_20;
  for (test_mac._4_4_ = 1; -1 < test_mac._4_4_; test_mac._4_4_ = test_mac._4_4_ + -1) {
    *(undefined8 *)(max_to_use + 0x68 + (long)test_mac._4_4_ * 8) = 0;
    *(undefined8 *)(max_to_use + 0x78 + (long)test_mac._4_4_ * 8) = 0;
  }
  *(undefined8 *)(max_to_use + 0x88) = 0;
  *(undefined8 *)(max_to_use + 0x90) = 0;
  *(undefined8 *)(max_to_use + 0x98) = 0xa8;
  (mem->pub).alloc_large = (_func_void_ptr_j_common_ptr_int_size_t *)max_to_use;
  pcStack_38 = getenv("JPEGMEM");
  if (pcStack_38 != (char *)0x0) {
    local_39 = 'x';
    iVar1 = __isoc99_sscanf(pcStack_38,"%ld%c",&stack0xffffffffffffffe0,&local_39);
    if (0 < iVar1) {
      if ((local_39 == 'm') || (local_39 == 'M')) {
        lStack_20 = lStack_20 * 1000;
      }
      *(long *)(max_to_use + 0x58) = lStack_20 * 1000;
    }
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_memory_mgr (j_common_ptr cinfo)
{
  my_mem_ptr mem;
  long max_to_use;
  int pool;
  size_t test_mac;

  cinfo->mem = NULL;		/* for safety if init fails */

  /* Check for configuration errors.
   * SIZEOF(ALIGN_TYPE) should be a power of 2; otherwise, it probably
   * doesn't reflect any real hardware alignment requirement.
   * The test is a little tricky: for X>0, X and X-1 have no one-bits
   * in common if and only if X is a power of 2, ie has only one one-bit.
   * Some compilers may give an "unreachable code" warning here; ignore it.
   */
  if ((SIZEOF(ALIGN_TYPE) & (SIZEOF(ALIGN_TYPE)-1)) != 0)
    ERREXIT(cinfo, JERR_BAD_ALIGN_TYPE);
  /* MAX_ALLOC_CHUNK must be representable as type size_t, and must be
   * a multiple of SIZEOF(ALIGN_TYPE).
   * Again, an "unreachable code" warning may be ignored here.
   * But a "constant too large" warning means you need to fix MAX_ALLOC_CHUNK.
   */
  test_mac = (size_t) MAX_ALLOC_CHUNK;
  if ((long) test_mac != MAX_ALLOC_CHUNK ||
      (MAX_ALLOC_CHUNK % SIZEOF(ALIGN_TYPE)) != 0)
    ERREXIT(cinfo, JERR_BAD_ALLOC_CHUNK);

  max_to_use = jpeg_mem_init(cinfo); /* system-dependent initialization */

  /* Attempt to allocate memory manager's control block */
  mem = (my_mem_ptr) jpeg_get_small(cinfo, SIZEOF(my_memory_mgr));

  if (mem == NULL) {
    jpeg_mem_term(cinfo);	/* system-dependent cleanup */
    ERREXIT1(cinfo, JERR_OUT_OF_MEMORY, 0);
  }

  /* OK, fill in the method pointers */
  mem->pub.alloc_small = alloc_small;
  mem->pub.alloc_large = alloc_large;
  mem->pub.alloc_sarray = alloc_sarray;
  mem->pub.alloc_barray = alloc_barray;
  mem->pub.request_virt_sarray = request_virt_sarray;
  mem->pub.request_virt_barray = request_virt_barray;
  mem->pub.realize_virt_arrays = realize_virt_arrays;
  mem->pub.access_virt_sarray = access_virt_sarray;
  mem->pub.access_virt_barray = access_virt_barray;
  mem->pub.free_pool = free_pool;
  mem->pub.self_destruct = self_destruct;

  /* Make MAX_ALLOC_CHUNK accessible to other modules */
  mem->pub.max_alloc_chunk = MAX_ALLOC_CHUNK;

  /* Initialize working state */
  mem->pub.max_memory_to_use = max_to_use;

  for (pool = JPOOL_NUMPOOLS-1; pool >= JPOOL_PERMANENT; pool--) {
    mem->small_list[pool] = NULL;
    mem->large_list[pool] = NULL;
  }
  mem->virt_sarray_list = NULL;
  mem->virt_barray_list = NULL;

  mem->total_space_allocated = SIZEOF(my_memory_mgr);

  /* Declare ourselves open for business */
  cinfo->mem = & mem->pub;

  /* Check for an environment variable JPEGMEM; if found, override the
   * default max_memory setting from jpeg_mem_init.  Note that the
   * surrounding application may again override this value.
   * If your system doesn't support getenv(), define NO_GETENV to disable
   * this feature.
   */
#ifndef NO_GETENV
  { char * memenv;

    if ((memenv = getenv("JPEGMEM")) != NULL) {
      char ch = 'x';

      if (sscanf(memenv, "%ld%c", &max_to_use, &ch) > 0) {
	if (ch == 'm' || ch == 'M')
	  max_to_use *= 1000L;
	mem->pub.max_memory_to_use = max_to_use * 1000L;
      }
    }
  }
#endif

}